

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_unpc(Pixel *out,Pixel *in,Background *back)

{
  byte bVar1;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  if (in->a < 0x81) {
    out->b = 0xff;
    out->g = 0xff;
    out->r = 0xff;
    out->a = 0;
  }
  else {
    bVar1 = sRGB((double)in->r / (double)in->a);
    out->r = (uint)bVar1;
    bVar1 = sRGB((double)in->g / (double)in->a);
    out->g = (uint)bVar1;
    bVar1 = sRGB((double)in->b / (double)in->a);
    out->b = (uint)bVar1;
    bVar1 = u8d((double)in->a / 257.0);
    out->a = (uint)bVar1;
  }
  return;
}

Assistant:

static void
gpc_unpc(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   if (in->a <= 128)
   {
      out->r = out->g = out->b = 255;
      out->a = 0;
   }

   else
   {
      out->r = sRGB((double)in->r / in->a);
      out->g = sRGB((double)in->g / in->a);
      out->b = sRGB((double)in->b / in->a);
      out->a = u8d(in->a / 257.);
   }
}